

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpWithTcpClient.cpp
# Opt level: O2

void __thiscall
sznet::net::KcpWithTcpClient::newTcpConnection(KcpWithTcpClient *this,sz_sock sockfd)

{
  uint id;
  undefined8 uVar1;
  TcpConnection *this_00;
  char local_108 [8];
  char buf [32];
  sockaddr_in6 local_dc;
  _Bind<void_(sznet::net::KcpWithTcpClient::*(sznet::net::KcpWithTcpClient_*,_std::_Placeholder<1>))(const_std::shared_ptr<sznet::net::TcpConnection>_&)>
  local_c0;
  undefined1 local_a8 [8];
  InetAddress localAddr;
  undefined1 local_80 [8];
  string connName;
  TcpConnectionPtr conn;
  MutexLockGuard lock;
  
  EventLoop::assertInLoopThread(this->m_loop);
  sockets::sz_sock_getpeeraddr(&local_dc,sockfd);
  id = this->m_nextConnId;
  this->m_nextConnId = id + 1;
  InetAddress::toIpPort_abi_cxx11_((string *)local_80,(InetAddress *)&local_dc);
  snprintf(local_108,0x20,":tcp-%s#%d",local_80,(ulong)id);
  std::__cxx11::string::~string((string *)local_80);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                 &this->m_name,local_108);
  sockets::sz_sock_getlocaladdr
            ((sockaddr_in6 *)
             &conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,sockfd);
  local_a8 = (undefined1  [8])
             conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  this_00 = (TcpConnection *)operator_new(0x1d0);
  TcpConnection::TcpConnection
            (this_00,this->m_loop,(string *)local_80,id,sockfd,(InetAddress *)local_a8,
             (InetAddress *)&local_dc);
  std::__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<sznet::net::TcpConnection,void>
            ((__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> *)
             (connName.field_2._M_local_buf + 8),this_00);
  uVar1 = connName.field_2._8_8_;
  local_c0._M_bound_args.
  super__Tuple_impl<0UL,_sznet::net::KcpWithTcpClient_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_sznet::net::KcpWithTcpClient_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_sznet::net::KcpWithTcpClient_*,_std::_Placeholder<1>_>)&this->m_tcpCodec;
  local_c0._M_f =
       (offset_in_KcpWithTcpClient_to_subr)
       LengthHeaderCodec<std::shared_ptr<sznet::net::TcpConnection>_>::onMessage;
  local_c0._8_8_ = 0;
  std::
  function<void(std::shared_ptr<sznet::net::TcpConnection>const&,sznet::net::Buffer*,sznet::Timestamp)>
  ::
  function<std::_Bind<void(sznet::net::LengthHeaderCodec<std::shared_ptr<sznet::net::TcpConnection>>::*(sznet::net::LengthHeaderCodec<std::shared_ptr<sznet::net::TcpConnection>>*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(std::shared_ptr<sznet::net::TcpConnection>const&,sznet::net::Buffer*,sznet::Timestamp)>,void>
            ((function<void(std::shared_ptr<sznet::net::TcpConnection>const&,sznet::net::Buffer*,sznet::Timestamp)>
              *)&conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount,
             (_Bind<void_(sznet::net::LengthHeaderCodec<std::shared_ptr<sznet::net::TcpConnection>_>::*(sznet::net::LengthHeaderCodec<std::shared_ptr<sznet::net::TcpConnection>_>_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
              *)&local_c0);
  std::
  function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
  ::operator=((function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
               *)(uVar1 + 0xb0),
              (function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
               *)&conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
  std::_Function_base::~_Function_base
            ((_Function_base *)
             &conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  uVar1 = connName.field_2._8_8_;
  local_c0._M_f = (offset_in_KcpWithTcpClient_to_subr)removeTcpConnection;
  local_c0._8_8_ = 0;
  local_c0._M_bound_args.
  super__Tuple_impl<0UL,_sznet::net::KcpWithTcpClient_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_sznet::net::KcpWithTcpClient_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_sznet::net::KcpWithTcpClient_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_sznet::net::KcpWithTcpClient_*,_std::_Placeholder<1>_>)this;
  std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>::
  function<std::_Bind<void(sznet::net::KcpWithTcpClient::*(sznet::net::KcpWithTcpClient*,std::_Placeholder<1>))(std::shared_ptr<sznet::net::TcpConnection>const&)>,void>
            ((function<void(std::shared_ptr<sznet::net::TcpConnection>const&)> *)
             &conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_c0);
  std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::operator=
            ((function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)> *)(uVar1 + 0x110),
             (function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)> *)
             &conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::_Function_base::~_Function_base
            ((_Function_base *)
             &conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->m_mutex;
  MutexLock::lock((MutexLock *)
                  conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi);
  std::__shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_tcpConnection).
              super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)&connName.field_2 + 8));
  MutexLockGuard::~MutexLockGuard
            ((MutexLockGuard *)
             &conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  TcpConnection::connectEstablished((TcpConnection *)connName.field_2._8_8_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&conn);
  std::__cxx11::string::~string((string *)local_80);
  return;
}

Assistant:

void KcpWithTcpClient::newTcpConnection(sockets::sz_sock sockfd)
{
	m_loop->assertInLoopThread();
	InetAddress peerAddr(sockets::sz_sock_getpeeraddr(sockfd));
	char buf[32];
	uint32_t connId = m_nextConnId++;
	snprintf(buf, sizeof(buf), ":tcp-%s#%d", peerAddr.toIpPort().c_str(), connId);
	string connName = m_name + buf;

	InetAddress localAddr(sockets::sz_sock_getlocaladdr(sockfd));
	// FIXME poll with zero timeout to double confirm the new connection
	// FIXME use make_shared if necessary
	TcpConnectionPtr conn(new TcpConnection(m_loop, connName, connId, sockfd, localAddr, peerAddr));
	conn->setMessageCallback(std::bind(&LengthHeaderCodec<>::onMessage, &m_tcpCodec, std::placeholders::_1, std::placeholders::_2, std::placeholders::_3));
	// FIXME: unsafe
	conn->setCloseCallback(std::bind(&KcpWithTcpClient::removeTcpConnection, this, std::placeholders::_1));
	// ��������ͬʱ��д����race condition
	{
		MutexLockGuard lock(m_mutex);
		m_tcpConnection = conn;
	}
	conn->connectEstablished();
}